

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# gzread.c
# Opt level: O3

int cm_zlib_gzread(gzFile file,voidp buf,uint len)

{
  int iVar1;
  z_size_t zVar2;
  int iVar3;
  
  iVar3 = -1;
  if (((file != (gzFile)0x0) && (file[1].have == 0x1c4f)) &&
     ((iVar1 = *(int *)((long)&file[4].pos + 4), iVar1 == 0 || (iVar1 == -5)))) {
    if ((int)len < 0) {
      cm_zlib_gz_error((gz_statep)file,-2,"request does not fit in an int");
    }
    else {
      zVar2 = gz_read((gz_statep)file,buf,(ulong)len);
      if ((((int)zVar2 != 0) || (iVar1 = *(int *)((long)&file[4].pos + 4), iVar1 == 0)) ||
         (iVar1 == -5)) {
        iVar3 = (int)zVar2;
      }
    }
  }
  return iVar3;
}

Assistant:

int ZEXPORT gzread(gzFile file, voidp buf, unsigned len) {
    gz_statep state;

    /* get internal structure */
    if (file == NULL)
        return -1;
    state = (gz_statep)file;

    /* check that we're reading and that there's no (serious) error */
    if (state->mode != GZ_READ ||
            (state->err != Z_OK && state->err != Z_BUF_ERROR))
        return -1;

    /* since an int is returned, make sure len fits in one, otherwise return
       with an error (this avoids a flaw in the interface) */
    if ((int)len < 0) {
        gz_error(state, Z_STREAM_ERROR, "request does not fit in an int");
        return -1;
    }

    /* read len or fewer bytes to buf */
    len = (unsigned)gz_read(state, buf, len);

    /* check for an error */
    if (len == 0 && state->err != Z_OK && state->err != Z_BUF_ERROR)
        return -1;

    /* return the number of bytes read (this is assured to fit in an int) */
    return (int)len;
}